

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

bool llvm::DWARFAttribute::mayHaveLocationDescription(Attribute Attr)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,Attr) < 0x4d) {
    uVar1 = CONCAT22(in_register_0000003a,Attr) - 0xb;
    if ((uVar1 < 0x40) && ((0xa820301880804005U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      return true;
    }
    if (CONCAT22(in_register_0000003a,Attr) == 2) {
      return true;
    }
  }
  else {
    uVar1 = CONCAT22(in_register_0000003a,Attr) - 0x4d;
    if ((uVar1 < 0x3a) && ((0x3c6001000000017U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
      return true;
    }
    if (CONCAT22(in_register_0000003a,Attr) == 0x2111) {
      return true;
    }
    if (CONCAT22(in_register_0000003a,Attr) == 0x2113) {
      return true;
    }
  }
  return false;
}

Assistant:

bool DWARFAttribute::mayHaveLocationDescription(dwarf::Attribute Attr) {
  switch (Attr) {
  // From the DWARF v5 specification.
  case DW_AT_location:
  case DW_AT_byte_size:
  case DW_AT_bit_size:
  case DW_AT_string_length:
  case DW_AT_lower_bound:
  case DW_AT_return_addr:
  case DW_AT_bit_stride:
  case DW_AT_upper_bound:
  case DW_AT_count:
  case DW_AT_data_member_location:
  case DW_AT_frame_base:
  case DW_AT_segment:
  case DW_AT_static_link:
  case DW_AT_use_location:
  case DW_AT_vtable_elem_location:
  case DW_AT_allocated:
  case DW_AT_associated:
  case DW_AT_byte_stride:
  case DW_AT_rank:
  case DW_AT_call_value:
  case DW_AT_call_origin:
  case DW_AT_call_target:
  case DW_AT_call_target_clobbered:
  case DW_AT_call_data_location:
  case DW_AT_call_data_value:
  // Extensions.
  case DW_AT_GNU_call_site_value:
  case DW_AT_GNU_call_site_target:
    return true;
  default:
    return false;
  }
}